

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpcommon.c
# Opt level: O3

_Bool BinarySource_get_fxp_attrs(BinarySource *src,fxp_attrs *attrs)

{
  int iVar1;
  ulong uVar2;
  uint64_t uVar3;
  unsigned_long uVar4;
  
  uVar2 = BinarySource_get_uint32(src->binarysource_);
  attrs->flags = uVar2;
  if ((uVar2 & 1) != 0) {
    uVar3 = BinarySource_get_uint64(src->binarysource_);
    attrs->size = uVar3;
    uVar2 = attrs->flags;
  }
  if ((uVar2 & 2) != 0) {
    uVar4 = BinarySource_get_uint32(src->binarysource_);
    attrs->uid = uVar4;
    uVar4 = BinarySource_get_uint32(src->binarysource_);
    attrs->gid = uVar4;
    uVar2 = attrs->flags;
  }
  if ((uVar2 & 4) != 0) {
    uVar4 = BinarySource_get_uint32(src->binarysource_);
    attrs->permissions = uVar4;
    uVar2 = attrs->flags;
  }
  iVar1 = (int)uVar2;
  if ((uVar2 & 8) != 0) {
    uVar4 = BinarySource_get_uint32(src->binarysource_);
    attrs->atime = uVar4;
    uVar4 = BinarySource_get_uint32(src->binarysource_);
    attrs->mtime = uVar4;
    iVar1 = (int)attrs->flags;
  }
  if (iVar1 < 0) {
    uVar4 = BinarySource_get_uint32(src->binarysource_);
    while ((uVar4 != 0 && (src->binarysource_->err == BSE_NO_ERROR))) {
      BinarySource_get_string(src->binarysource_);
      BinarySource_get_string(src->binarysource_);
      uVar4 = uVar4 - 1;
    }
  }
  return true;
}

Assistant:

bool BinarySource_get_fxp_attrs(BinarySource *src, struct fxp_attrs *attrs)
{
    attrs->flags = get_uint32(src);
    if (attrs->flags & SSH_FILEXFER_ATTR_SIZE)
        attrs->size = get_uint64(src);
    if (attrs->flags & SSH_FILEXFER_ATTR_UIDGID) {
        attrs->uid = get_uint32(src);
        attrs->gid = get_uint32(src);
    }
    if (attrs->flags & SSH_FILEXFER_ATTR_PERMISSIONS)
        attrs->permissions = get_uint32(src);
    if (attrs->flags & SSH_FILEXFER_ATTR_ACMODTIME) {
        attrs->atime = get_uint32(src);
        attrs->mtime = get_uint32(src);
    }
    if (attrs->flags & SSH_FILEXFER_ATTR_EXTENDED) {
        unsigned long count = get_uint32(src);
        while (count--) {
            if (get_err(src)) {
                /* Truncated packet. Don't waste time looking for
                 * attributes that aren't there. Caller should spot
                 * the truncation. */
                break;
            }
            /*
             * We should try to analyse these, if we ever find one
             * we recognise.
             */
            get_string(src);
            get_string(src);
        }
    }
    return true;
}